

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint hash_init(Hash *hash,uint windowsize)

{
  int *piVar1;
  unsigned_short *puVar2;
  uint local_20;
  uint i;
  uint windowsize_local;
  Hash *hash_local;
  
  piVar1 = (int *)lodepng_malloc(0x40000);
  hash->head = piVar1;
  piVar1 = (int *)lodepng_malloc((ulong)windowsize << 2);
  hash->val = piVar1;
  puVar2 = (unsigned_short *)lodepng_malloc((ulong)windowsize << 1);
  hash->chain = puVar2;
  puVar2 = (unsigned_short *)lodepng_malloc((ulong)windowsize << 1);
  hash->zeros = puVar2;
  piVar1 = (int *)lodepng_malloc(0x40c);
  hash->headz = piVar1;
  puVar2 = (unsigned_short *)lodepng_malloc((ulong)windowsize << 1);
  hash->chainz = puVar2;
  if ((((hash->head == (int *)0x0) || (hash->chain == (unsigned_short *)0x0)) ||
      (hash->val == (int *)0x0)) ||
     (((hash->headz == (int *)0x0 || (hash->chainz == (unsigned_short *)0x0)) ||
      (hash->zeros == (unsigned_short *)0x0)))) {
    hash_local._4_4_ = 0x53;
  }
  else {
    for (local_20 = 0; local_20 != 0x10000; local_20 = local_20 + 1) {
      hash->head[local_20] = -1;
    }
    for (local_20 = 0; local_20 != windowsize; local_20 = local_20 + 1) {
      hash->val[local_20] = -1;
    }
    for (local_20 = 0; local_20 != windowsize; local_20 = local_20 + 1) {
      hash->chain[local_20] = (unsigned_short)local_20;
    }
    for (local_20 = 0; local_20 < 0x103; local_20 = local_20 + 1) {
      hash->headz[local_20] = -1;
    }
    for (local_20 = 0; local_20 != windowsize; local_20 = local_20 + 1) {
      hash->chainz[local_20] = (unsigned_short)local_20;
    }
    hash_local._4_4_ = 0;
  }
  return hash_local._4_4_;
}

Assistant:

static unsigned hash_init(Hash* hash, unsigned windowsize)
{
  unsigned i;
  hash->head = (int*)lodepng_malloc(sizeof(int) * HASH_NUM_VALUES);
  hash->val = (int*)lodepng_malloc(sizeof(int) * windowsize);
  hash->chain = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);

  hash->zeros = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);
  hash->headz = (int*)lodepng_malloc(sizeof(int) * (MAX_SUPPORTED_DEFLATE_LENGTH + 1));
  hash->chainz = (unsigned short*)lodepng_malloc(sizeof(unsigned short) * windowsize);

  if(!hash->head || !hash->chain || !hash->val  || !hash->headz|| !hash->chainz || !hash->zeros)
  {
    return 83; /*alloc fail*/
  }

  /*initialize hash table*/
  for(i = 0; i != HASH_NUM_VALUES; ++i) hash->head[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->val[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->chain[i] = i; /*same value as index indicates uninitialized*/

  for(i = 0; i <= MAX_SUPPORTED_DEFLATE_LENGTH; ++i) hash->headz[i] = -1;
  for(i = 0; i != windowsize; ++i) hash->chainz[i] = i; /*same value as index indicates uninitialized*/

  return 0;
}